

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASValue.cpp
# Opt level: O1

void __thiscall ASValue::addUser(ASValue *this,uint idx,ASValue *user)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)operator_new(0x20);
  p_Var2[1]._M_next = (_List_node_base *)user;
  *(uint *)&p_Var2[1]._M_prev = idx;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->_use).super__List_base<ASUse,_std::allocator<ASUse>_>._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void ASValue::addUser(unsigned int idx, ASValue *user) { _use.emplace_back(user, idx); }